

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_read_raw_utf8(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uVar5;
  long unaff_RBX;
  int *__haystack;
  bson_iter_t iter;
  undefined1 auStack_320 [16];
  code *pcStack_310;
  int iStack_308;
  int iStack_304;
  char acStack_300 [504];
  code *pcStack_108;
  undefined1 auStack_100 [232];
  
  pcStack_108 = (code *)0x12fcc7;
  lVar3 = bson_new_from_json(anon_var_dwarf_1a5dd,0xffffffffffffffff,0);
  if (lVar3 == 0) {
    pcStack_108 = (code *)0x12fd62;
    test_bson_json_read_raw_utf8_cold_5();
LAB_0012fd62:
    pcStack_108 = (code *)0x12fd67;
    test_bson_json_read_raw_utf8_cold_1();
    lVar3 = unaff_RBX;
LAB_0012fd67:
    pcStack_108 = (code *)0x12fd6c;
    test_bson_json_read_raw_utf8_cold_4();
LAB_0012fd6c:
    pcStack_108 = (code *)0x12fd74;
    test_bson_json_read_raw_utf8_cold_2();
  }
  else {
    pcStack_108 = (code *)0x12fce8;
    cVar1 = bson_iter_init_find(auStack_100,lVar3,anon_var_dwarf_49b7 + 0xc);
    unaff_RBX = lVar3;
    if (cVar1 == '\0') goto LAB_0012fd62;
    pcStack_108 = (code *)0x12fcf4;
    pcVar4 = (char *)bson_iter_key(auStack_100);
    if (pcVar4 != anon_var_dwarf_49b7 + 0xc) {
      pcStack_108 = (code *)0x12fd01;
      pcVar4 = (char *)bson_iter_key(auStack_100);
      pcStack_108 = (code *)0x12fd10;
      iVar2 = strcmp(pcVar4,anon_var_dwarf_49b7 + 0xc);
      if (iVar2 == 0) goto LAB_0012fd14;
      goto LAB_0012fd6c;
    }
LAB_0012fd14:
    pcStack_108 = (code *)0x12fd1e;
    pcVar4 = (char *)bson_iter_utf8(auStack_100);
    if (pcVar4 == anon_var_dwarf_49b7 + 0xc) {
LAB_0012fd40:
      pcStack_108 = (code *)0x12fd48;
      cVar1 = bson_iter_next(auStack_100);
      if (cVar1 == '\0') {
        pcStack_108 = (code *)0x12fd54;
        bson_destroy(lVar3);
        return;
      }
      goto LAB_0012fd67;
    }
    pcStack_108 = (code *)0x12fd2d;
    pcVar4 = (char *)bson_iter_utf8(auStack_100,0);
    pcStack_108 = (code *)0x12fd3c;
    iVar2 = strcmp(pcVar4,anon_var_dwarf_49b7 + 0xc);
    if (iVar2 == 0) goto LAB_0012fd40;
  }
  pcStack_108 = test_bson_json_read_corrupt_utf8;
  test_bson_json_read_raw_utf8_cold_3();
  __haystack = &iStack_308;
  pcStack_310 = (code *)0x12fd96;
  pcStack_108 = (code *)lVar3;
  memset(&iStack_308,0,0x200);
  pcStack_310 = (code *)0x12fdac;
  lVar3 = bson_new_from_json(anon_var_dwarf_1a625,0xffffffffffffffff,&iStack_308);
  if (lVar3 == 0) {
    __haystack = &iStack_308;
    if (iStack_308 != 1) goto LAB_0012fe2e;
    __haystack = &iStack_308;
    if (iStack_304 != 1) goto LAB_0012fe33;
    __haystack = (int *)acStack_300;
    pcStack_310 = (code *)0x12fdd6;
    pcVar4 = strstr((char *)__haystack,"invalid bytes in UTF8 string");
    if (pcVar4 == (char *)0x0) goto LAB_0012fe38;
    pcStack_310 = (code *)0x12fdf1;
    lVar3 = bson_new_from_json(anon_var_dwarf_1a631,0xffffffffffffffff,&iStack_308);
    if (lVar3 != 0) goto LAB_0012fe29;
    if (iStack_308 != 1) goto LAB_0012fe40;
    if (iStack_304 == 1) {
      pcStack_310 = (code *)0x12fe16;
      pcVar4 = strstr((char *)__haystack,"invalid bytes in UTF8 string");
      if (pcVar4 != (char *)0x0) {
        return;
      }
      goto LAB_0012fe4a;
    }
  }
  else {
    pcStack_310 = (code *)0x12fe29;
    test_bson_json_read_corrupt_utf8_cold_1();
LAB_0012fe29:
    pcStack_310 = (code *)0x12fe2e;
    test_bson_json_read_corrupt_utf8_cold_4();
LAB_0012fe2e:
    pcStack_310 = (code *)0x12fe33;
    test_bson_json_read_corrupt_utf8_cold_2();
LAB_0012fe33:
    pcStack_310 = (code *)0x12fe38;
    test_bson_json_read_corrupt_utf8_cold_3();
LAB_0012fe38:
    pcStack_310 = (code *)0x12fe40;
    test_bson_json_read_corrupt_utf8_cold_8();
LAB_0012fe40:
    pcStack_310 = (code *)0x12fe45;
    test_bson_json_read_corrupt_utf8_cold_5();
  }
  pcStack_310 = (code *)0x12fe4a;
  test_bson_json_read_corrupt_utf8_cold_6();
LAB_0012fe4a:
  pcStack_310 = test_bson_json_read_decimal128;
  test_bson_json_read_corrupt_utf8_cold_7();
  pcStack_310 = (code *)__haystack;
  bson_decimal128_from_string("123.5",auStack_320);
  uVar5 = bson_bcon_magic();
  iVar2 = 0x14aa08;
  uVar5 = bcon_new(0,"decimal",uVar5,0x12,auStack_320,0);
  _test_bson_json_read_compare("{ \"decimal\" : { \"$numberDecimal\" : \"123.5\" }}",iVar2,uVar5,0);
  return;
}

Assistant:

static void
test_bson_json_read_raw_utf8 (void)
{
   bson_t *bson;
   bson_iter_t iter;

   bson = bson_new_from_json (
      (const uint8_t *) "{\"" EU "\": \"" EU "\"}", -1, NULL);
   ASSERT (bson);
   ASSERT (bson_iter_init_find (&iter, bson, EU));
   ASSERT_CMPSTR (bson_iter_key (&iter), EU);
   ASSERT_CMPSTR (bson_iter_utf8 (&iter, NULL), EU);
   ASSERT (!bson_iter_next (&iter));

   bson_destroy (bson);
}